

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O0

char * p2sc_bin2hex(guint8 *bin,size_t len)

{
  byte bVar1;
  char *pcVar2;
  ulong in_RSI;
  long in_RDI;
  guint8 b;
  size_t i;
  char *hex;
  size_t alen;
  ulong local_28;
  
  pcVar2 = (char *)g_malloc(in_RSI * 2 + 1);
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    bVar1 = *(byte *)(in_RDI + local_28);
    pcVar2[local_28 * 2] = "0123456789ABCDEF"[(int)(uint)bVar1 >> 4];
    pcVar2[local_28 * 2 + 1] = "0123456789ABCDEF"[(int)(bVar1 & 0xf)];
  }
  pcVar2[in_RSI * 2] = '\0';
  return pcVar2;
}

Assistant:

char *p2sc_bin2hex(const guint8 *bin, size_t len) {
    static const char hexdig[] = "0123456789ABCDEF";

    size_t alen = len * 2;
    char *hex = (char *) g_malloc(alen + 1);

    for (size_t i = 0; i < len; ++i) {
        guint8 b = bin[i];

        hex[2 * i] = hexdig[b >> 4];
        hex[2 * i + 1] = hexdig[b & 0xf];
    }
    hex[alen] = 0;

    return hex;
}